

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestLazyMessage::Clear(TestLazyMessage *this)

{
  TestAllTypes *this_00;
  LogMessageFatal LStack_18;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    this_00 = (this->field_0)._impl_.sub_message_;
    if (this_00 == (TestAllTypes *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
                 ,0x61e9,"_impl_.sub_message_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    edition_unittest::TestAllTypes::Clear(this_00);
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestLazyMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestLazyMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.sub_message_ != nullptr);
    _impl_.sub_message_->Clear();
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}